

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O2

void compute_dim_order(int num_dims,int max_dim,int *dim_order)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < num_dims) {
    uVar2 = (ulong)(uint)num_dims;
  }
  while (uVar2 != uVar1) {
    iVar3 = (int)(uVar1 + 1);
    if ((long)uVar1 < (long)max_dim) {
      iVar3 = (int)uVar1;
    }
    dim_order[uVar1] = iVar3;
    uVar1 = uVar1 + 1;
  }
  dim_order[(long)num_dims + -1] = max_dim;
  return;
}

Assistant:

void compute_dim_order(int num_dims, int max_dim, int *dim_order) {
  for (int i = 0; i < num_dims; i++) {
	if (i < max_dim) {
	  dim_order[i] = i;
	} else {
	  dim_order[i] = i + 1;
	}
  }
  dim_order[num_dims - 1] = max_dim;
}